

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellBST::SetupInitial(ChElementShellBST *this,ChSystem *system)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pointer psVar15;
  byte bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  ChLog *this_00;
  undefined8 uVar31;
  undefined8 extraout_RAX;
  ulong uVar32;
  double dVar33;
  long lVar34;
  ChElementShellBST *pCVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double dVar59;
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  double dVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  ChVector<double> Li [3];
  double adStack_1e0 [6];
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  undefined8 uStack_190;
  double local_188;
  ChElementShellBST *local_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  undefined8 uStack_160;
  double local_158;
  double local_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  double local_118;
  double local_110;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  undefined1 local_78 [8];
  double adStack_70 [5];
  double dStack_48;
  double dStack_40;
  double local_38;
  
  local_148._8_8_ = local_148._0_8_;
  local_138._8_8_ = local_138._0_8_;
  local_128._8_8_ = local_128._0_8_;
  adStack_1e0[0] = 3.9432016539273e-317;
  SetAsNeutral(this);
  adStack_1e0[0] = 3.94321400556845e-317;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(local_78);
  adStack_1e0[0] = 3.94322438094701e-317;
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 2);
  local_128._0_8_ = (double)local_78 - adStack_1e0[2];
  local_138._0_8_ = adStack_70[0] - adStack_1e0[3];
  local_148._0_8_ = adStack_70[1] - adStack_1e0[4];
  adStack_1e0[0] = 3.94326538839562e-317;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
  adStack_1e0[0] = 3.94327724597112e-317;
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_c8);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = local_148._0_8_;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = local_138._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_1a8 - local_b8;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = (local_1b0 - local_c0) * (double)local_148._0_8_;
  auVar47 = vfmsub231sd_fma(auVar52,auVar113,auVar47);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = local_128._0_8_;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = adStack_1e0[5] - local_c8;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = (local_1a8 - local_b8) * (double)local_128._0_8_;
  auVar54 = vfmsub231sd_fma(auVar98,auVar54,auVar132);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_1b0 - local_c0;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = (adStack_1e0[5] - local_c8) * (double)local_138._0_8_;
  auVar53 = vfmsub231sd_fma(auVar114,auVar122,auVar53);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = auVar54._0_8_ * auVar54._0_8_;
  auVar47 = vfmadd231sd_fma(auVar61,auVar47,auVar47);
  auVar47 = vfmadd231sd_fma(auVar47,auVar53,auVar53);
  if (auVar47._0_8_ < 0.0) {
    adStack_1e0[0] = 3.94333801604555e-317;
    dVar33 = sqrt(auVar47._0_8_);
  }
  else {
    auVar47 = vsqrtsd_avx(auVar47,auVar47);
    dVar33 = auVar47._0_8_;
  }
  this->area = dVar33 * 0.5;
  _local_78 = ZEXT1664(ZEXT816(0));
  local_38 = 0.0;
  adStack_1e0[0] = 3.94337210657512e-317;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 2);
  adStack_1e0[0] = 3.94338297601933e-317;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
  auVar29 = _local_78;
  local_a0 = adStack_1e0[2] - adStack_1e0[5];
  local_a8 = adStack_1e0[3] - local_1b0;
  local_118 = adStack_1e0[4] - local_1a8;
  adStack_70[0] = local_a8;
  local_78 = (undefined1  [8])local_a0;
  stack0xffffffffffffffa0 = auVar29._24_40_;
  adStack_70[1] = local_118;
  adStack_1e0[0] = 3.94343682917472e-317;
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 2);
  adStack_1e0[0] = 3.94344769861893e-317;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
  auVar29 = _local_78;
  local_98 = adStack_1e0[2] - adStack_1e0[5];
  adStack_70[2] = local_98;
  adStack_70[3] = adStack_1e0[3] - local_1b0;
  _dStack_48 = auVar29._48_16_;
  adStack_70[4] = adStack_1e0[4] - local_1a8;
  adStack_1e0[0] = 3.94349315265835e-317;
  (**(code **)(*(long *)&((this->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 2);
  adStack_1e0[0] = 3.94350352803691e-317;
  (**(code **)(*(long *)&((((this->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
  auVar29 = _local_78;
  local_b0 = adStack_1e0[2] - adStack_1e0[5];
  local_168 = adStack_1e0[3] - local_1b0;
  local_d0 = adStack_1e0[4] - local_1a8;
  dStack_48 = local_b0;
  dStack_40 = local_168;
  auVar30 = _local_78;
  local_38 = local_d0;
  adStack_70[3] = auVar29._32_8_;
  local_178 = adStack_70[3];
  adStack_70[4] = auVar29._40_8_;
  local_108 = adStack_70[4];
  lVar36 = 0;
  _local_78 = auVar30;
  do {
    dVar33 = *(double *)(local_78 + lVar36);
    auVar123._8_8_ = 0;
    auVar123._0_8_ = dVar33;
    dVar141 = *(double *)(local_78 + lVar36 + 8);
    dVar60 = *(double *)(local_78 + lVar36 + 0x10);
    auVar137._8_8_ = 0;
    auVar137._0_8_ = dVar60;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = dVar141 * dVar141;
    auVar47 = vfmadd231sd_fma(auVar142,auVar123,auVar123);
    auVar143 = vfmadd231sd_fma(auVar47,auVar137,auVar137);
    local_198 = auVar143._0_8_;
    local_128._0_8_ = dVar33;
    local_138._0_8_ = dVar141;
    local_148._0_8_ = dVar60;
    if (local_198 < 0.0) {
      adStack_1e0[0] = 3.94361815126675e-317;
      dVar59 = sqrt(local_198);
      auVar143._8_8_ = 0;
      auVar143._0_8_ = local_198;
      dVar141 = (double)local_138._0_8_;
      dVar33 = (double)local_128._0_8_;
      dVar60 = (double)local_148._0_8_;
    }
    else {
      auVar47 = vsqrtsd_avx(auVar143,auVar143);
      dVar59 = auVar47._0_8_;
    }
    bVar24 = 2.2250738585072014e-308 <= dVar59;
    dVar59 = 1.0 / dVar59;
    auVar39._0_8_ = (ulong)bVar24 * (long)(dVar33 * dVar59) + (ulong)!bVar24 * 0x3ff0000000000000;
    auVar39._8_8_ = 0;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = (ulong)bVar24 * (long)(dVar60 * dVar59);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_a0;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = (double)((ulong)bVar24 * (long)(dVar141 * dVar59)) * local_a8;
    auVar47 = vfmadd231sd_fma(auVar79,auVar39,auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_118;
    auVar47 = vfmadd231sd_fma(auVar47,auVar40,auVar2);
    *(long *)((long)this->cM[0].m_data + lVar36) = auVar47._0_8_;
    if (auVar143._0_8_ < 0.0) {
      adStack_1e0[0] = 3.94369868396702e-317;
      dVar59 = sqrt(auVar143._0_8_);
      auVar143._8_8_ = 0;
      auVar143._0_8_ = local_198;
      dVar141 = (double)local_138._0_8_;
      dVar33 = (double)local_128._0_8_;
      dVar60 = (double)local_148._0_8_;
    }
    else {
      auVar47 = vsqrtsd_avx(auVar143,auVar143);
      dVar59 = auVar47._0_8_;
    }
    bVar24 = 2.2250738585072014e-308 <= dVar59;
    dVar59 = 1.0 / dVar59;
    auVar41._0_8_ = (ulong)bVar24 * (long)(dVar33 * dVar59) + (ulong)!bVar24 * 0x3ff0000000000000;
    auVar41._8_8_ = 0;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = (ulong)bVar24 * (long)(dVar60 * dVar59);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_98;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = (double)((ulong)bVar24 * (long)(dVar141 * dVar59)) * local_178;
    auVar47 = vfmadd231sd_fma(auVar80,auVar41,auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_108;
    auVar47 = vfmadd231sd_fma(auVar47,auVar42,auVar4);
    *(long *)((long)this->cM[0].m_data + lVar36 + 8) = auVar47._0_8_;
    if (auVar143._0_8_ < 0.0) {
      adStack_1e0[0] = 3.94377773447035e-317;
      dVar59 = sqrt(auVar143._0_8_);
      dVar141 = (double)local_138._0_8_;
      dVar33 = (double)local_128._0_8_;
      dVar60 = (double)local_148._0_8_;
    }
    else {
      auVar47 = vsqrtsd_avx(auVar143,auVar143);
      dVar59 = auVar47._0_8_;
    }
    bVar24 = 2.2250738585072014e-308 <= dVar59;
    dVar59 = 1.0 / dVar59;
    auVar43._0_8_ = (ulong)bVar24 * (long)(dVar33 * dVar59) + (ulong)!bVar24 * 0x3ff0000000000000;
    auVar43._8_8_ = 0;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = (ulong)bVar24 * (long)(dVar60 * dVar59);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_b0;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = (double)((ulong)bVar24 * (long)(dVar141 * dVar59)) * local_168;
    auVar47 = vfmadd231sd_fma(auVar81,auVar43,auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_d0;
    auVar47 = vfmadd231sd_fma(auVar47,auVar44,auVar6);
    *(long *)((long)this->cM[0].m_data + lVar36 + 0x10) = auVar47._0_8_;
    lVar36 = lVar36 + 0x18;
  } while (lVar36 != 0x48);
  uVar37 = 2;
  dVar33 = 4.94065645841247e-324;
  lVar36 = 0x168;
  lVar38 = 0;
  pCVar35 = this;
  local_180 = this;
  do {
    psVar15 = (pCVar35->m_nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (*(long *)((long)&psVar15[3].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + lVar38) == 0) {
      *(undefined1 (*) [16])((long)pCVar35->nodes_used_to_six + lVar36 + -0x5c) = ZEXT816(0) << 0x40
      ;
      *(undefined8 *)((long)pCVar35->nodes_used_to_six + lVar36 + -0x4c) = 0;
    }
    else {
      lVar34 = (long)dVar33;
      if (lVar38 == 0x20) {
        lVar34 = 0;
      }
      adStack_1e0[0] = 3.94390964999779e-317;
      local_110 = dVar33;
      (**(code **)(*(long *)&(psVar15[lVar34].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 2);
      adStack_1e0[0] = 3.94392298977023e-317;
      (**(code **)(**(long **)((long)&(local_180->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(uVar37 / 3) * -3 + 2].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar38) + 0x60))(adStack_1e0 + 5);
      local_150 = adStack_1e0[2] - adStack_1e0[5];
      local_158 = adStack_1e0[3] - local_1b0;
      local_1a0 = adStack_1e0[4] - local_1a8;
      adStack_1e0[0] = 3.94396498535013e-317;
      (**(code **)(**(long **)((long)&(local_180->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar38) + 0x60))(adStack_1e0 + 2);
      adStack_1e0[0] = 3.94397832512256e-317;
      (**(code **)(*(long *)&((local_180->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar34].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
      local_108 = adStack_1e0[2] - adStack_1e0[5];
      local_f8 = adStack_1e0[3] - local_1b0;
      local_e8 = adStack_1e0[4] - local_1a8;
      adStack_1e0[0] = 3.94402081476811e-317;
      (**(code **)(**(long **)((long)&(this->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(uVar37 / 3) * -3 + 2].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar38) + 0x60))(adStack_1e0 + 2);
      adStack_1e0[0] = 3.94403020201538e-317;
      (**(code **)(**(long **)((long)&(this->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar38) + 0x60))(adStack_1e0 + 5);
      local_198 = adStack_1e0[2] - adStack_1e0[5];
      local_178 = adStack_1e0[3] - local_1b0;
      local_168 = adStack_1e0[4] - local_1a8;
      dVar33 = *(double *)((long)adStack_1e0 + lVar36);
      auVar124._8_8_ = 0;
      auVar124._0_8_ = dVar33;
      dVar141 = *(double *)((long)adStack_1e0 + lVar36 + 8);
      dVar60 = *(double *)((long)adStack_1e0 + lVar36 + 0x10);
      auVar138._8_8_ = 0;
      auVar138._0_8_ = dVar60;
      auVar144._8_8_ = 0;
      auVar144._0_8_ = dVar141 * dVar141;
      auVar47 = vfmadd231sd_fma(auVar144,auVar124,auVar124);
      auVar145 = vfmadd231sd_fma(auVar47,auVar138,auVar138);
      local_188 = auVar145._0_8_;
      local_128._0_8_ = dVar33;
      local_138._0_8_ = dVar141;
      local_148._0_8_ = dVar60;
      if (local_188 < 0.0) {
        adStack_1e0[0] = 3.94411369910953e-317;
        dVar59 = sqrt(local_188);
        auVar145._8_8_ = 0;
        auVar145._0_8_ = local_188;
        dVar141 = (double)local_138._0_8_;
        dVar33 = (double)local_128._0_8_;
        dVar60 = (double)local_148._0_8_;
      }
      else {
        auVar47 = vsqrtsd_avx(auVar145,auVar145);
        dVar59 = auVar47._0_8_;
      }
      pCVar35 = local_180;
      bVar24 = 2.2250738585072014e-308 <= dVar59;
      dVar59 = 1.0 / dVar59;
      auVar45._0_8_ = (ulong)bVar24 * (long)(dVar33 * dVar59) + (ulong)!bVar24 * 0x3ff0000000000000;
      auVar45._8_8_ = 0;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = (ulong)bVar24 * (long)(dVar60 * dVar59);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_150;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = (double)((ulong)bVar24 * (long)(dVar141 * dVar59)) * local_158;
      auVar47 = vfmadd231sd_fma(auVar82,auVar45,auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_1a0;
      auVar47 = vfmadd231sd_fma(auVar47,auVar46,auVar8);
      auVar18._8_8_ = 0x8000000000000000;
      auVar18._0_8_ = 0x8000000000000000;
      auVar47 = vxorpd_avx512vl(auVar47,auVar18);
      uVar31 = vmovlpd_avx(auVar47);
      *(undefined8 *)((long)local_180->nodes_used_to_six + lVar36 + -0x5c) = uVar31;
      if (auVar145._0_8_ < 0.0) {
        adStack_1e0[0] = 3.94419867840061e-317;
        dVar59 = sqrt(auVar145._0_8_);
        auVar145._8_8_ = 0;
        auVar145._0_8_ = local_188;
        dVar141 = (double)local_138._0_8_;
        dVar33 = (double)local_128._0_8_;
        dVar60 = (double)local_148._0_8_;
      }
      else {
        auVar47 = vsqrtsd_avx(auVar145,auVar145);
        dVar59 = auVar47._0_8_;
      }
      bVar24 = 2.2250738585072014e-308 <= dVar59;
      dVar59 = 1.0 / dVar59;
      auVar48._0_8_ = (ulong)bVar24 * (long)(dVar33 * dVar59) + (ulong)!bVar24 * 0x3ff0000000000000;
      auVar48._8_8_ = 0;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = (ulong)bVar24 * (long)(dVar60 * dVar59);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_108;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = (double)((ulong)bVar24 * (long)(dVar141 * dVar59)) * local_f8;
      auVar47 = vfmadd231sd_fma(auVar83,auVar48,auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_e8;
      auVar47 = vfmadd231sd_fma(auVar47,auVar49,auVar10);
      auVar19._8_8_ = 0x8000000000000000;
      auVar19._0_8_ = 0x8000000000000000;
      auVar47 = vxorpd_avx512vl(auVar47,auVar19);
      uVar31 = vmovlpd_avx(auVar47);
      *(undefined8 *)((long)pCVar35->nodes_used_to_six + lVar36 + -0x54) = uVar31;
      if (auVar145._0_8_ < 0.0) {
        adStack_1e0[0] = 3.9442826695604e-317;
        dVar59 = sqrt(auVar145._0_8_);
        dVar141 = (double)local_138._0_8_;
        dVar33 = (double)local_128._0_8_;
        dVar60 = (double)local_148._0_8_;
      }
      else {
        auVar47 = vsqrtsd_avx(auVar145,auVar145);
        dVar59 = auVar47._0_8_;
      }
      bVar24 = 2.2250738585072014e-308 <= dVar59;
      dVar59 = 1.0 / dVar59;
      auVar50._0_8_ = (ulong)bVar24 * (long)(dVar33 * dVar59) + (ulong)!bVar24 * 0x3ff0000000000000;
      auVar50._8_8_ = 0;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = (ulong)bVar24 * (long)(dVar60 * dVar59);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_198;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = (double)((ulong)bVar24 * (long)(dVar141 * dVar59)) * local_178;
      auVar47 = vfmadd231sd_fma(auVar84,auVar50,auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_168;
      auVar47 = vfmadd231sd_fma(auVar47,auVar51,auVar12);
      auVar20._8_8_ = 0x8000000000000000;
      auVar20._0_8_ = 0x8000000000000000;
      auVar47 = vxorpd_avx512vl(auVar47,auVar20);
      uVar31 = vmovlpd_avx(auVar47);
      *(undefined8 *)((long)pCVar35->nodes_used_to_six + lVar36 + -0x4c) = uVar31;
      dVar33 = local_110;
    }
    lVar38 = lVar38 + 0x10;
    uVar37 = uVar37 + 1;
    dVar33 = (double)((long)dVar33 + 1);
    lVar36 = lVar36 + 0x18;
  } while (lVar38 != 0x30);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = local_a0;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_a8 * local_a8;
  auVar47 = vfmadd213sd_fma(auVar85,auVar85,auVar62);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_118;
  auVar47 = vfmadd213sd_fma(auVar63,auVar63,auVar47);
  if (auVar47._0_8_ < 0.0) {
    adStack_1e0[0] = 3.94439284619943e-317;
    dVar33 = sqrt(auVar47._0_8_);
  }
  else {
    auVar47 = vsqrtsd_avx(auVar47,auVar47);
    dVar33 = auVar47._0_8_;
  }
  (pCVar35->l0).m_data[0] = dVar33;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = adStack_70[4];
  auVar99._8_8_ = 0;
  auVar99._0_8_ = local_98;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = adStack_70[3] * adStack_70[3];
  auVar47 = vfmadd213sd_fma(auVar99,auVar99,auVar64);
  auVar47 = vfmadd231sd_fma(auVar47,auVar86,auVar86);
  if (auVar47._0_8_ < 0.0) {
    adStack_1e0[0] = 3.94442990112286e-317;
    dVar33 = sqrt(auVar47._0_8_);
  }
  else {
    auVar47 = vsqrtsd_avx(auVar47,auVar47);
    dVar33 = auVar47._0_8_;
  }
  auVar87._8_8_ = 0;
  auVar87._0_8_ = local_d0;
  (pCVar35->l0).m_data[1] = dVar33;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = local_b0;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dStack_40 * dStack_40;
  auVar47 = vfmadd213sd_fma(auVar100,auVar100,auVar65);
  auVar47 = vfmadd213sd_fma(auVar87,auVar87,auVar47);
  if (auVar47._0_8_ < 0.0) {
    adStack_1e0[0] = 3.9444669560463e-317;
    dVar33 = sqrt(auVar47._0_8_);
  }
  else {
    auVar47 = vsqrtsd_avx(auVar47,auVar47);
    dVar33 = auVar47._0_8_;
  }
  (pCVar35->l0).m_data[2] = dVar33;
  adStack_1e0[0] = 3.94448227208132e-317;
  (**(code **)(*(long *)&((pCVar35->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 2);
  adStack_1e0[0] = 3.94449264745989e-317;
  (**(code **)(*(long *)&((((pCVar35->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
  local_198 = adStack_1e0[2] - adStack_1e0[5];
  local_168 = adStack_1e0[3] - local_1b0;
  local_178 = adStack_1e0[4] - local_1a8;
  adStack_1e0[0] = 3.94452920831768e-317;
  (**(code **)(*(long *)&((pCVar35->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 2);
  adStack_1e0[0] = 3.94453958369624e-317;
  (**(code **)(*(long *)&((((pCVar35->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_178;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = local_168;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = adStack_1e0[4] - local_1a8;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = (adStack_1e0[3] - local_1b0) * local_178;
  auVar54 = vfmsub231sd_fma(auVar115,auVar125,auVar101);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = local_198;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = adStack_1e0[2] - adStack_1e0[5];
  auVar102._8_8_ = 0;
  auVar102._0_8_ = (adStack_1e0[4] - local_1a8) * local_198;
  auVar47 = vfmsub231sd_fma(auVar102,auVar133,auVar66);
  dVar33 = auVar47._0_8_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = adStack_1e0[3] - local_1b0;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = (adStack_1e0[2] - adStack_1e0[5]) * local_168;
  auVar53 = vfmsub231sd_fma(auVar126,auVar109,auVar88);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar33 * dVar33;
  auVar47 = vfmadd231sd_fma(auVar67,auVar54,auVar54);
  auVar47 = vfmadd231sd_fma(auVar47,auVar53,auVar53);
  if (auVar47._0_8_ < 0.0) {
    local_128._0_8_ = auVar54._0_8_;
    local_138._0_8_ = dVar33;
    local_148._0_8_ = auVar53._0_8_;
    adStack_1e0[0] = 3.9446092469523e-317;
    dVar60 = sqrt(auVar47._0_8_);
  }
  else {
    auVar47 = vsqrtsd_avx(auVar47,auVar47);
    dVar60 = auVar47._0_8_;
    local_138._0_8_ = dVar33;
    local_128._0_8_ = auVar54._0_8_;
    local_148._0_8_ = auVar53._0_8_;
  }
  bVar24 = 2.2250738585072014e-308 <= dVar60;
  dVar60 = 1.0 / dVar60;
  dVar33 = (double)local_128._0_8_ * dVar60;
  dVar141 = (double)((ulong)bVar24 * (long)((double)local_138._0_8_ * dVar60));
  local_128._8_8_ = 0;
  local_128._0_8_ = dVar141;
  local_138._0_8_ = (ulong)bVar24 * (long)dVar33 + (ulong)!bVar24 * 0x3ff0000000000000;
  local_138._8_8_ = 0;
  dVar33 = (double)((ulong)bVar24 * (long)((double)local_148._0_8_ * dVar60));
  local_148._8_8_ = 0;
  local_148._0_8_ = dVar33;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = local_168;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_178;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = local_168 * dVar33;
  auVar47 = vfmsub231sd_fma(auVar134,local_128,auVar89);
  local_108 = auVar47._0_8_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = local_198;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = local_178 * (double)local_138._0_8_;
  auVar54 = vfmsub231sd_fma(auVar139,local_148,auVar90);
  auVar146._8_8_ = 0;
  auVar146._0_8_ = local_198 * dVar141;
  auVar53 = vfmsub231sd_fma(auVar146,local_138,auVar127);
  local_f8 = auVar53._0_8_;
  dVar33 = auVar54._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar33 * dVar33;
  auVar47 = vfmadd231sd_fma(auVar68,auVar47,auVar47);
  auVar47 = vfmadd231sd_fma(auVar47,auVar53,auVar53);
  if (auVar47._0_8_ < 0.0) {
    local_e8._0_4_ = auVar54._0_4_;
    local_e8._4_4_ = auVar54._4_4_;
    adStack_1e0[0] = 3.94472090578826e-317;
    dVar60 = sqrt(auVar47._0_8_);
    dVar33 = (double)CONCAT44(local_e8._4_4_,(undefined4)local_e8);
  }
  else {
    auVar47 = vsqrtsd_avx(auVar47,auVar47);
    dVar60 = auVar47._0_8_;
  }
  bVar24 = 2.2250738585072014e-308 <= dVar60;
  dVar60 = 1.0 / dVar60;
  dVar141 = dVar60 * local_108;
  local_108 = (double)((ulong)bVar24 * (long)(dVar60 * dVar33));
  uStack_100 = 0;
  local_e8 = (double)((ulong)bVar24 * (long)dVar141 + (ulong)!bVar24 * 0x3ff0000000000000);
  uStack_e0 = 0;
  local_f8 = (double)((ulong)bVar24 * (long)(local_f8 * dVar60));
  uStack_f0 = 0;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = local_198;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_168 * local_168;
  auVar47 = vfmadd231sd_fma(auVar69,auVar91,auVar91);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = local_178;
  auVar47 = vfmadd231sd_fma(auVar47,auVar92,auVar92);
  if (auVar47._0_8_ < 0.0) {
    adStack_1e0[0] = 3.94480588507935e-317;
    dVar33 = sqrt(auVar47._0_8_);
  }
  else {
    auVar47 = vsqrtsd_avx(auVar47,auVar47);
    dVar33 = auVar47._0_8_;
  }
  bVar24 = 2.2250738585072014e-308 <= dVar33;
  dVar33 = 1.0 / dVar33;
  dVar60 = dVar33 * local_168;
  dVar141 = dVar33 * local_178;
  local_168 = (double)((ulong)bVar24 * (long)(dVar33 * local_198) +
                      (ulong)!bVar24 * 0x3ff0000000000000);
  uStack_160 = 0;
  local_178 = (double)((ulong)bVar24 * (long)dVar60);
  uStack_170 = 0;
  local_198 = (double)((ulong)bVar24 * (long)dVar141);
  uStack_190 = 0;
  adStack_1e0[0] = 3.94485825603781e-317;
  (**(code **)(*(long *)&((((pCVar35->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 2);
  local_158 = adStack_1e0[2];
  local_1a0 = adStack_1e0[3];
  local_150 = adStack_1e0[4];
  adStack_1e0[0] = 3.9448893821735e-317;
  (**(code **)(*(long *)&((pCVar35->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
  local_158 = adStack_1e0[5] * 0.0 + local_158;
  local_1a0 = local_1b0 * 0.0 + local_1a0;
  local_188 = local_1a8 * 0.0 + local_150;
  adStack_1e0[0] = 3.94493434214727e-317;
  (**(code **)(*(long *)&((pCVar35->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_c8);
  local_150 = local_158 - local_c8;
  local_158 = local_1a0 - local_c0;
  local_1a0 = local_188 - local_b8;
  adStack_1e0[0] = 3.94497534959587e-317;
  (**(code **)(*(long *)&((((pCVar35->m_nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 2);
  local_188 = adStack_1e0[2] * 0.0;
  local_110 = adStack_1e0[3] * 0.0;
  local_118 = adStack_1e0[4] * 0.0;
  adStack_1e0[0] = 3.94500845199414e-317;
  (**(code **)(*(long *)&((pCVar35->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
  local_188 = local_188 + adStack_1e0[5];
  local_110 = local_110 + local_1b0;
  local_118 = local_118 + local_1a8;
  adStack_1e0[0] = 3.94505291790227e-317;
  (**(code **)(*(long *)&((pCVar35->m_nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x60))(&local_c8);
  auVar26._8_8_ = uStack_160;
  auVar26._0_8_ = local_168;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = local_150;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_178 * local_158;
  auVar47 = vfmadd231sd_fma(auVar70,auVar147,auVar26);
  auVar25._8_8_ = uStack_190;
  auVar25._0_8_ = local_198;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = local_1a0;
  auVar47 = vfmadd231sd_fma(auVar47,auVar149,auVar25);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = local_178 * (local_110 - local_c0);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = local_188 - local_c8;
  auVar54 = vfmadd231sd_fma(auVar93,auVar116,auVar26);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = local_118 - local_b8;
  auVar54 = vfmadd231sd_fma(auVar54,auVar128,auVar25);
  auVar28._8_8_ = uStack_e0;
  auVar28._0_8_ = local_e8;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = local_108 * local_158;
  auVar53 = vfmadd231sd_fma(auVar103,auVar28,auVar147);
  auVar27._8_8_ = uStack_f0;
  auVar27._0_8_ = local_f8;
  auVar53 = vfmadd231sd_fma(auVar53,auVar27,auVar149);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = local_108 * (local_110 - local_c0);
  auVar61 = vfmadd231sd_fma(auVar110,auVar116,auVar28);
  auVar61 = vfmadd231sd_fma(auVar61,auVar128,auVar27);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = auVar54._0_8_ * auVar53._0_8_;
  auVar98 = vfmsub231sd_fma(auVar117,auVar47,auVar61);
  auVar21._8_8_ = 0x7fffffffffffffff;
  auVar21._0_8_ = 0x7fffffffffffffff;
  auVar52 = vandpd_avx512vl(auVar98,auVar21);
  if (auVar52._0_8_ <= 1e-10) {
    adStack_1e0[0] = 3.94519422067698e-317;
    this_00 = GetLog();
    adStack_1e0[0] = 3.94520163166167e-317;
    ChStreamOutAscii::operator<<
              (&this_00->super_ChStreamOutAscii,
               "Warning: a ChElementShellBST is not invertible (degenerate triangle? \n");
  }
  else {
    auVar22._8_8_ = 0x8000000000000000;
    auVar22._0_8_ = 0x8000000000000000;
    auVar53 = vxorpd_avx512vl(auVar53,auVar22);
    dVar33 = 1.0 / auVar98._0_8_;
    (pCVar35->Jux).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
    array[0] = auVar61._0_8_ * dVar33;
    (pCVar35->Jux).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
    array[2] = dVar33 * auVar53._0_8_;
    auVar23._8_8_ = 0x8000000000000000;
    auVar23._0_8_ = 0x8000000000000000;
    auVar54 = vxorpd_avx512vl(auVar54,auVar23);
    (pCVar35->Jux).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
    array[1] = dVar33 * auVar54._0_8_;
    (pCVar35->Jux).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_1,_2,_2>_>.m_storage.m_data.
    array[3] = auVar47._0_8_ * dVar33;
  }
  if (pCVar35 != (ChElementShellBST *)&std::__ioinit) {
    (pCVar35->e0).m_data[0] = VNULL;
    (pCVar35->e0).m_data[1] = DAT_00b90ac0;
    (pCVar35->e0).m_data[2] = DAT_00b90ac8;
  }
  if (pCVar35 !=
      (ChElementShellBST *)
      GetLog::static_cout_logger.super_ChLog.super_ChStreamOutAscii.number_format) {
    (pCVar35->k0).m_data[0] = VNULL;
    (pCVar35->k0).m_data[1] = DAT_00b90ac0;
    (pCVar35->k0).m_data[2] = DAT_00b90ac8;
  }
  uVar37 = 2;
  lVar38 = 1;
  lVar36 = 0;
  do {
    psVar15 = (pCVar35->m_nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (*(long *)((long)&psVar15[3].
                         super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + lVar36 * 2) == 0) {
      *(undefined8 *)((long)(pCVar35->phi0).m_data + lVar36) = 0;
      dVar33 = 0.5;
    }
    else {
      uVar32 = uVar37 / 3;
      adStack_1e0[0] = 3.94530637357859e-317;
      (**(code **)(**(long **)((long)&psVar15[3].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar36 * 2) + 0x60))(adStack_1e0 + 2);
      lVar34 = lVar38;
      if (lVar36 == 0x10) {
        lVar34 = 0;
      }
      adStack_1e0[0] = 3.94532712433571e-317;
      (**(code **)(*(long *)&((pCVar35->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar34].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
      local_198 = adStack_1e0[2] - adStack_1e0[5];
      local_168 = adStack_1e0[3] - local_1b0;
      local_178 = adStack_1e0[4] - local_1a8;
      adStack_1e0[0] = 3.94536615552173e-317;
      (**(code **)(**(long **)((long)&(pCVar35->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar32 * -3 + 2].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar36 * 2) + 0x60))(&local_c8);
      adStack_1e0[0] = 3.94537702496594e-317;
      uVar31 = (**(code **)(*(long *)&((pCVar35->m_nodes).
                                       super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar34].
                                       super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_90);
      auVar135._8_8_ = 0;
      auVar135._0_8_ = local_178;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = local_168;
      auVar104._8_8_ = 0;
      auVar104._0_8_ = local_b8 - local_80;
      auVar111._8_8_ = 0;
      auVar111._0_8_ = (local_c0 - local_88) * local_178;
      auVar47 = vfmsub231sd_fma(auVar111,auVar118,auVar104);
      auVar129._8_8_ = 0;
      auVar129._0_8_ = local_198;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = local_c8 - local_90;
      auVar105._8_8_ = 0;
      auVar105._0_8_ = (local_b8 - local_80) * local_198;
      auVar54 = vfmsub231sd_fma(auVar105,auVar71,auVar135);
      auVar94._8_8_ = 0;
      auVar94._0_8_ = local_c0 - local_88;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = (local_c8 - local_90) * local_168;
      auVar53 = vfmsub231sd_fma(auVar119,auVar129,auVar94);
      local_168 = auVar54._0_8_;
      local_198 = auVar47._0_8_;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = local_168 * local_168;
      auVar47 = vfmadd231sd_fma(auVar72,auVar47,auVar47);
      local_178 = auVar53._0_8_;
      auVar47 = vfmadd231sd_fma(auVar47,auVar53,auVar53);
      if (auVar47._0_8_ < 0.0) {
        adStack_1e0[0] = 3.94546447458526e-317;
        local_108 = sqrt(auVar47._0_8_);
        uVar31 = extraout_RAX;
      }
      else {
        auVar47 = vsqrtsd_avx(auVar47,auVar47);
        local_108 = auVar47._0_8_;
      }
      pCVar35 = local_180;
      local_e8._0_4_ =
           (undefined4)CONCAT71((int7)((ulong)uVar31 >> 8),2.2250738585072014e-308 <= local_108);
      adStack_1e0[0] = 3.94549362445836e-317;
      (**(code **)(*(long *)&((local_180->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar34].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 2);
      adStack_1e0[0] = 3.94550449390257e-317;
      (**(code **)(**(long **)((long)&(pCVar35->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar32 * -3 + 2].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar36 * 2) + 0x60))(adStack_1e0 + 5);
      auVar95._8_8_ = 0;
      auVar95._0_8_ = adStack_1e0[3] - local_1b0;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = local_128._0_8_ * (adStack_1e0[4] - local_1a8);
      auVar54 = vfmsub231sd_fma(auVar130,auVar95,local_148);
      auVar106._8_8_ = 0;
      auVar106._0_8_ = adStack_1e0[4] - local_1a8;
      auVar140._8_8_ = 0;
      auVar140._0_8_ = local_148._0_8_ * (adStack_1e0[2] - adStack_1e0[5]);
      auVar47 = vfmsub231sd_fma(auVar140,local_138,auVar106);
      auVar73._8_8_ = 0;
      auVar73._0_8_ = adStack_1e0[2] - adStack_1e0[5];
      auVar148._8_8_ = 0;
      auVar148._0_8_ = local_138._0_8_ * (adStack_1e0[3] - local_1b0);
      auVar53 = vfmsub231sd_fma(auVar148,local_128,auVar73);
      dVar33 = auVar47._0_8_;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = dVar33 * dVar33;
      auVar47 = vfmadd231sd_fma(auVar74,auVar54,auVar54);
      auVar47 = vfmadd231sd_fma(auVar47,auVar53,auVar53);
      if (auVar47._0_8_ < 0.0) {
        adStack_1e0[0] = 3.9455781096838e-317;
        local_1a0 = auVar53._0_8_;
        local_150 = dVar33;
        local_f8 = auVar54._0_8_;
        dVar59 = sqrt(auVar47._0_8_);
        dVar60 = local_f8;
        dVar141 = local_1a0;
        dVar33 = local_150;
      }
      else {
        auVar47 = vsqrtsd_avx(auVar47,auVar47);
        dVar59 = auVar47._0_8_;
        dVar60 = auVar54._0_8_;
        dVar141 = auVar53._0_8_;
      }
      dVar78 = 1.0 / local_108;
      bVar16 = (byte)(undefined4)local_e8;
      dVar17 = (double)((ulong)(bVar16 & 1) * (long)(dVar78 * local_168));
      auVar55._0_8_ =
           (ulong)(bVar16 & 1) * (long)(dVar78 * local_198) +
           (ulong)!(bool)(bVar16 & 1) * 0x3ff0000000000000;
      auVar55._8_8_ = 0;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = (ulong)(bVar16 & 1) * (long)(dVar78 * local_178);
      bVar24 = 2.2250738585072014e-308 <= dVar59;
      dVar59 = 1.0 / dVar59;
      auVar57._0_8_ = (ulong)bVar24 * (long)(dVar59 * dVar60) + (ulong)!bVar24 * 0x3ff0000000000000;
      auVar57._8_8_ = 0;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = (ulong)bVar24 * (long)(dVar141 * dVar59);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_138._0_8_;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = dVar17 * (double)local_128._0_8_;
      auVar47 = vfmadd231sd_fma(auVar96,auVar55,auVar13);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_148._0_8_;
      auVar47 = vfmadd231sd_fma(auVar47,auVar56,auVar14);
      auVar75._8_8_ = 0;
      auVar75._0_8_ = dVar17 * (double)((ulong)bVar24 * (long)(dVar33 * dVar59));
      auVar54 = vfmadd231sd_fma(auVar75,auVar55,auVar57);
      auVar54 = vfmadd231sd_fma(auVar54,auVar56,auVar58);
      adStack_1e0[0] = 3.94567346435345e-317;
      dVar33 = atan2(auVar54._0_8_,auVar47._0_8_);
      pCVar35 = local_180;
      *(double *)((long)(local_180->phi0).m_data + lVar36) = dVar33;
      adStack_1e0[0] = 3.9456902625854e-317;
      (**(code **)(**(long **)((long)&(local_180->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar36 * 2) + 0x60))(adStack_1e0 + 2);
      adStack_1e0[0] = 3.94569964983268e-317;
      (**(code **)(*(long *)&((pCVar35->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar34].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(adStack_1e0 + 5);
      local_198 = adStack_1e0[2] - adStack_1e0[5];
      local_168 = adStack_1e0[3] - local_1b0;
      local_178 = adStack_1e0[4] - local_1a8;
      adStack_1e0[0] = 3.94573719882176e-317;
      (**(code **)(**(long **)((long)&(pCVar35->m_nodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar32 * -3 + 2].
                                      super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar36 * 2) + 0x60))(&local_c8);
      adStack_1e0[0] = 3.94574806826597e-317;
      (**(code **)(*(long *)&((pCVar35->m_nodes).
                              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar34].
                              super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->super_ChNodeFEAbase + 0x60))(&local_90);
      auVar136._8_8_ = 0;
      auVar136._0_8_ = local_178;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = local_168;
      auVar107._8_8_ = 0;
      auVar107._0_8_ = local_b8 - local_80;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = (local_c0 - local_88) * local_178;
      auVar47 = vfmsub231sd_fma(auVar112,auVar120,auVar107);
      auVar131._8_8_ = 0;
      auVar131._0_8_ = local_198;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = local_c8 - local_90;
      auVar108._8_8_ = 0;
      auVar108._0_8_ = (local_b8 - local_80) * local_198;
      auVar54 = vfmsub231sd_fma(auVar108,auVar76,auVar136);
      auVar97._8_8_ = 0;
      auVar97._0_8_ = local_c0 - local_88;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = (local_c8 - local_90) * local_168;
      auVar53 = vfmsub231sd_fma(auVar121,auVar131,auVar97);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = auVar54._0_8_ * auVar54._0_8_;
      auVar47 = vfmadd231sd_fma(auVar77,auVar47,auVar47);
      auVar47 = vfmadd231sd_fma(auVar47,auVar53,auVar53);
      if (auVar47._0_8_ < 0.0) {
        adStack_1e0[0] = 3.94581427306251e-317;
        dVar33 = sqrt(auVar47._0_8_);
      }
      else {
        auVar47 = vsqrtsd_avx(auVar47,auVar47);
        dVar33 = auVar47._0_8_;
      }
      dVar60 = *(double *)((long)(local_180->l0).m_data + lVar36);
      dVar33 = 1.0 / (dVar33 / dVar60);
      dVar33 = dVar33 / (dVar33 + 1.0 / ((local_180->area + local_180->area) / dVar60));
      pCVar35 = local_180;
    }
    *(double *)((long)(pCVar35->rI).m_data + lVar36) = dVar33;
    lVar36 = lVar36 + 8;
    uVar37 = uVar37 + 1;
    lVar38 = lVar38 + 1;
  } while (lVar36 != 0x18);
  dVar33 = pCVar35->area * 4.0;
  (pCVar35->k0).m_data[0] = dVar33 * (pCVar35->k0).m_data[0];
  (pCVar35->k0).m_data[1] = dVar33 * (pCVar35->k0).m_data[1];
  (pCVar35->k0).m_data[2] = dVar33 * (pCVar35->k0).m_data[2];
  return;
}

Assistant:

void ChElementShellBST::SetupInitial(ChSystem* system) {

    // Align initial pos/rot of nodes to actual pos/rot
    SetAsNeutral();

	// Compute element area
	this->area = 0.5 * Vlength( Vcross(m_nodes[1]->GetX0() - m_nodes[0]->GetX0(), m_nodes[2]->GetX0() - m_nodes[0]->GetX0()) );
	
	// Compute cM and cI coefficients
	ChVector<> Li[3];
	Li[0] = m_nodes[2]->GetX0() - m_nodes[1]->GetX0();
	Li[1] = m_nodes[0]->GetX0() - m_nodes[2]->GetX0();
	Li[2] = m_nodes[1]->GetX0() - m_nodes[0]->GetX0();

	for (int i = 0; i < 3; ++i) {
		this->cM[i][0] = Vdot(Li[0], Li[i].GetNormalized());
		this->cM[i][1] = Vdot(Li[1], Li[i].GetNormalized());
		this->cM[i][2] = Vdot(Li[2], Li[i].GetNormalized());
	}
	ChVector<> LIi[3];
	for (int i = 0; i < 3; ++i) {
		if (m_nodes[i + 3] != nullptr) {
			LIi[0] = m_nodes[(i + 1) % 3]->GetX0() - m_nodes[(i + 2) % 3]->GetX0();
			LIi[1] = m_nodes[i + 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0();
			LIi[2] = m_nodes[(i + 2) % 3]->GetX0() - m_nodes[i + 3]->GetX0();
			this->cI[i][0] = -Vdot(LIi[0], Li[i].GetNormalized());
			this->cI[i][1] = -Vdot(LIi[1], Li[i].GetNormalized());
			this->cI[i][2] = -Vdot(LIi[2], Li[i].GetNormalized());
		}
		else {
			cI[i][0] = cI[i][1] = cI[i][2] = 0;
		}
	}

	// Compute initial side lengths
	this->l0[0] = Li[0].Length();
	this->l0[1] = Li[1].Length();
	this->l0[2] = Li[2].Length();

	// Compute orthogonal system at triangle in carthesian basis
	ChVector<> t0_1 = m_nodes[1]->GetX0() - m_nodes[0]->GetX0();
	ChVector<> t0_2 = m_nodes[2]->GetX0() - m_nodes[0]->GetX0();
	// Compute normal - and orthogonalize others
	ChVector<> t0_3 = Vcross(t0_1, t0_2).GetNormalized(); // The normal
	t0_2 = (Vcross(t0_3, t0_1)).GetNormalized();
	t0_1.Normalize();

	// Compute jacobian
	ShapeVector  N;
	this->ShapeFunctions(N, 1./3., 1./3.);
	ShapeVector  Nu;
	this->ShapeFunctionsDerivativeU(Nu, 1./3., 1./3.);
	ShapeVector  Nv;
	this->ShapeFunctionsDerivativeV(Nv, 1./3., 1./3.);

	//GetLog() << "Nu: " << Nu(0,0) << "  " << Nu(0,1) << "  " << Nu(0,2) << "\n" << "Nv: " << Nv(0,0) << "  " << Nv(0,1) << "  " << Nv(0,2) << "\n";

	ChVector<> P0_u = Nu(0,0) * m_nodes[0]->GetX0() + Nu(0,1) * m_nodes[1]->GetX0() + Nu(0,2) * m_nodes[2]->GetX0();
	ChVector<> P0_v = Nv(0,0) * m_nodes[0]->GetX0() + Nv(0,1) * m_nodes[1]->GetX0() + Nv(0,2) * m_nodes[2]->GetX0();
	//GetLog() << "t0_1= \n" << t0_1 <<  "\n";
	//GetLog() << "t0_2= \n" << t0_2 <<  "\n";
	//GetLog() << "P0_u= \n" << P0_u <<  "\n";
	//GetLog() << "P0_v= \n" << P0_v <<  "\n";

	ChMatrixNM<double, 2, 2> Jxu;
	Jxu(0, 0) = Vdot(P0_u, t0_1);
	Jxu(0, 1) = Vdot(P0_v, t0_1);
	Jxu(1, 0) = Vdot(P0_u, t0_2);
	Jxu(1, 1) = Vdot(P0_v, t0_2);
	//GetLog() << "Jxu= \n" << "  " << Jxu(0, 0) << "  " << Jxu(0, 1) << "\n" << "  " << Jxu(1, 0) << "  " << Jxu(1, 1) << "\n";

	bool invertible;
	Jxu.computeInverseWithCheck(this->Jux, invertible, 1e-10);
	if (!invertible)
		GetLog() << "Warning: a ChElementShellBST is not invertible (degenerate triangle? \n";
	//GetLog() << "Jux= \n" << "  " << Jux(0, 0) << "  " << Jux(0, 1) << "\n" << "  " << Jux(1, 0) << "  " << Jux(1, 1) << "\n";

	ShapeVector  Nx;
	this->ShapeFunctionsDerivativeX(Nx, this->Jux, 1./3., 1./3.);
	ShapeVector  Ny;
	this->ShapeFunctionsDerivativeY(Ny, this->Jux, 1./3., 1./3.);

	//GetLog() << "Nx: " << Nx(0) << "  " << Nx(1) << "  " << Nx(2) << "\n" << "Ny: " << Ny(0) << "  " << Ny(1) << "  " << Ny(2) << "\n";
	

	// Compute initial strain e0
	this->e0 = VNULL;

	// Compute initial edge bendings phi[i]
	// Use the BST method in "kinked and branched shells"
	this->k0 = VNULL;
	for (int i = 0; i < 3; ++i) {
		if (m_nodes[i + 3] != nullptr) {
			// normal of ith neighbouring triangle, opposed to ith triangle vertex:
			ChVector<> t0i_3 = Vcross(m_nodes[i + 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0(), m_nodes[(i + 2) % 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0()).GetNormalized();
			// boundary normal to shared edge:
			ChVector<> n_i = Vcross(m_nodes[(i + 1) % 3]->GetX0() - m_nodes[(i + 2) % 3]->GetX0(), t0_3).GetNormalized();
			// edge angle
			double mcos_fi = Vdot(t0_3, t0i_3);
			double msin_fi = Vdot(n_i, t0i_3);
			this->phi0[i] = atan2(msin_fi, mcos_fi);
			// curvature
			// NOT NEEDED? k here as 'change' of curvature in bent meshes, only phi0 matters.
			//this->k0 += VNULL;
			// precompute rI coefficients = RIi/(RMi/RIi) = (1/hIi)/((1/hMi)(1/hIi)) assuming heights h remains not changed
			double hIi = Vcross(m_nodes[i + 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0(), m_nodes[(i + 2) % 3]->GetX0() - m_nodes[(i + 1) % 3]->GetX0()).Length() / this->l0[i];
			double hMi = 2.0 * this->area / this->l0[i];
			this->rI[i] = (1.0 / hIi) / ((1.0 / hMi) + (1.0 / hIi));
		}
		else {
			this->phi0[i] = 0;
			this->rI[i] = 0.5;
			//this->k0 += VNULL;
		}
	}
	this->k0 *= this->area * 4.0;

    // Perform layer initialization
    for (size_t kl = 0; kl < m_layers.size(); kl++) {
        m_layers[kl].SetupInitial();
    }

}